

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void notValidDate(char *attrName)

{
  size_t sVar1;
  invalid_argument *this;
  stringstream e;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  long local_190 [47];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"The value for the ",0x12)
  ;
  if (attrName == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_190 + (int)*(undefined8 *)(local_190[0] + -0x18));
  }
  else {
    sVar1 = strlen(attrName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,attrName,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             " attribute is not a valid date of the form \"YYYY:MM:DD yy:mm:ss\"",0x40);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this,local_1c0);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
notValidDate (const char attrName[])
{
    std::stringstream e;
    e << "The value for the " << attrName
      << " attribute is not a valid date of the form \"YYYY:MM:DD yy:mm:ss\"";
    throw invalid_argument(e.str());
}